

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InductionVariable.cpp
# Opt level: O1

void __thiscall InductionVariable::ExpandInnerLoopChange(InductionVariable *this)

{
  int iVar1;
  int iVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  int32 upperBound;
  int32 lowerBound;
  IntConstantBounds local_20;
  
  if (this->sym == (StackSym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/InductionVariable.cpp"
                       ,0x95,"(IsValid())","IsValid()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar5 = 0;
  }
  if (this->isChangeDeterminate == true) {
    iVar1 = (this->changeBounds).lowerBound;
    iVar2 = (this->changeBounds).upperBound;
    lowerBound = -0x80000000;
    if (-1 < iVar1) {
      lowerBound = iVar1;
    }
    upperBound = 0x7fffffff;
    if (iVar2 < 1) {
      upperBound = iVar2;
    }
    IntConstantBounds::IntConstantBounds(&local_20,lowerBound,upperBound);
    this->changeBounds = local_20;
  }
  return;
}

Assistant:

void InductionVariable::ExpandInnerLoopChange()
{
    Assert(IsValid());

    if(!isChangeDeterminate)
        return;

    changeBounds =
        IntConstantBounds(
            changeBounds.LowerBound() < 0 ? IntConstMin : changeBounds.LowerBound(),
            changeBounds.UpperBound() > 0 ? IntConstMax : changeBounds.UpperBound());
}